

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Enterprise.cpp
# Opt level: O3

void __thiscall
Enterprise::ConcreteMachine<true,false>::type_string(ConcreteMachine<true,false> *this)

{
  ConcreteMachine<true,false> CVar1;
  string *in_RSI;
  
  Utility::TypeRecipient<Enterprise::CharacterMapper>::add_typer
            ((TypeRecipient<Enterprise::CharacterMapper> *)(this + 0xd8),in_RSI);
  CVar1 = (ConcreteMachine<true,false>)
          CPU::Z80::ProcessorBase::get_is_resetting((ProcessorBase *)(this + 0x60170));
  this[0x60163] = CVar1;
  *(uint *)(this + 0x60164) = (uint)(byte)CVar1;
  return;
}

Assistant:

void type_string(const std::string &string) final {
			Utility::TypeRecipient<CharacterMapper>::add_typer(string);

			if(z80_.get_is_resetting()) {
				should_skip_splash_screen_ = true;
				typer_delay_ = 1;
			} else {
				should_skip_splash_screen_ = false;
				typer_delay_ = 0;
			}
		}